

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * min_perf8(t_int *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  t_int tVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar1 = w[1];
  lVar2 = w[2];
  lVar3 = w[3];
  tVar4 = w[4];
  for (lVar5 = 0; (int)tVar4 != (int)lVar5; lVar5 = lVar5 + 8) {
    auVar6 = minps(*(undefined1 (*) [16])(lVar1 + lVar5 * 4),
                   *(undefined1 (*) [16])(lVar2 + lVar5 * 4));
    auVar7 = minps(*(undefined1 (*) [16])(lVar1 + 0x10 + lVar5 * 4),
                   *(undefined1 (*) [16])(lVar2 + 0x10 + lVar5 * 4));
    *(undefined1 (*) [16])(lVar3 + lVar5 * 4) = auVar6;
    *(undefined1 (*) [16])(lVar3 + 0x10 + lVar5 * 4) = auVar7;
  }
  return w + 5;
}

Assistant:

t_int *min_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = (f0 < g0 ? f0 : g0); out[1] = (f1 < g1 ? f1 : g1);
        out[2] = (f2 < g2 ? f2 : g2); out[3] = (f3 < g3 ? f3 : g3);
        out[4] = (f4 < g4 ? f4 : g4); out[5] = (f5 < g5 ? f5 : g5);
        out[6] = (f6 < g6 ? f6 : g6); out[7] = (f7 < g7 ? f7 : g7);
    }
    return (w+5);
}